

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::Merge(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  Descriptor *root_message_type;
  undefined1 local_158 [8];
  ParserImpl parser;
  Message *output_local;
  ZeroCopyInputStream *input_local;
  Parser *this_local;
  
  parser.no_op_fields_ = (UnsetFieldsMetadata *)output;
  root_message_type = Message::GetDescriptor(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_158,root_message_type,input,this->error_collector_,this->finder_,
             this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,
             (bool)(this->allow_case_insensitive_field_ & 1),(bool)(this->allow_unknown_field_ & 1),
             (bool)(this->allow_unknown_extension_ & 1),(bool)(this->allow_unknown_enum_ & 1),
             (bool)(this->allow_field_number_ & 1),(bool)(this->allow_relaxed_whitespace_ & 1),
             (bool)(this->allow_partial_ & 1),this->recursion_limit_,this->no_op_fields_);
  bVar1 = MergeUsingImpl(this,input,(Message *)parser.no_op_fields_,(ParserImpl *)local_158);
  ParserImpl::~ParserImpl((ParserImpl *)local_158);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Merge(io::ZeroCopyInputStream* input,
                               Message* output) {
  ParserImpl parser(output->GetDescriptor(), input, error_collector_, finder_,
                    parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_, no_op_fields_);
  return MergeUsingImpl(input, output, &parser);
}